

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

void __thiscall helics::apps::Echo::Echo(Echo *this,string_view name,FederateInfo *fedInfo)

{
  App::App(&this->super_App,name,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Echo_00482cc0;
  CLI::std::_Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_Deque_base
            (&(this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>);
  *(undefined8 *)((long)&(this->delayTimeLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTimeLock).super___mutex_base._M_mutex + 8) = 0;
  (this->delayTime).internalTimeCode = 0;
  this->echoCounter = 0;
  (this->delayTimeLock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  initialSetup(this);
  return;
}

Assistant:

Echo::Echo(std::string_view name, const FederateInfo& fedInfo): App(name, fedInfo)
    {
        initialSetup();
    }